

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PopLoopBlock(cmMakefile *this)

{
  _Elt_pointer piVar1;
  _Elt_pointer piVar2;
  _Elt_pointer piVar3;
  
  piVar2 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!this->LoopBlockCounter.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                  ,0xcee,"void cmMakefile::PopLoopBlock()");
  }
  piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_first;
  piVar3 = piVar2;
  if (piVar2 == piVar1) {
    piVar3 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (0 < piVar3[-1]) {
    if (piVar2 == piVar1) {
      piVar2 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar2[-1] = piVar2[-1] + -1;
    return;
  }
  __assert_fail("this->LoopBlockCounter.top() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmMakefile.cxx"
                ,0xcef,"void cmMakefile::PopLoopBlock()");
}

Assistant:

void cmMakefile::PopLoopBlock()
{
  assert(!this->LoopBlockCounter.empty());
  assert(this->LoopBlockCounter.top() > 0);
  this->LoopBlockCounter.top()--;
}